

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswmcpl.c
# Opt level: O2

int ssw2mcpl_app(int argc,char **argv)

{
  uint uVar1;
  int do_gzip;
  int surface_info;
  int double_prec;
  char *cfgfile;
  char *outfile;
  char *infile;
  
  ssw2mcpl_parse_args(argc,argv,&infile,&outfile,&cfgfile,&double_prec,&surface_info,&do_gzip);
  uVar1 = ssw2mcpl2(infile,outfile,double_prec,surface_info,do_gzip,cfgfile);
  return uVar1 ^ 1;
}

Assistant:

int ssw2mcpl_app(int argc,char** argv)
{
  const char * infile;
  const char * outfile;
  const char * cfgfile;
  int double_prec, surface_info, do_gzip;
  ssw2mcpl_parse_args(argc,argv,&infile,&outfile,&cfgfile,&double_prec,&surface_info,&do_gzip);
  int ok = ssw2mcpl2(infile, outfile,double_prec, surface_info, do_gzip,cfgfile);
  return ok ? 0 : 1;
}